

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_font_multiline.cpp
# Opt level: O0

void __thiscall Prog::draw_text(Prog *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_RDI;
  float fVar5;
  undefined4 uVar6;
  int x_00;
  float max_width;
  undefined8 uVar7;
  undefined8 in_XMM1_Qa;
  undefined8 uVar8;
  undefined4 uVar9;
  char *text;
  int flags;
  int h;
  int w;
  int sy;
  int sx;
  int y;
  int x;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int tick;
  int y_00;
  ALLEGRO_FONT *font;
  ALLEGRO_FONT *text_00;
  undefined4 local_24;
  int local_c;
  
  local_c = 10;
  iVar2 = HSlider::get_cur_value((HSlider *)(in_RDI + 0x2a0));
  iVar3 = VSlider::get_cur_value((VSlider *)(in_RDI + 0x2e0));
  local_24 = 0;
  pcVar4 = TextEntry::get_text((TextEntry *)0x10b78f);
  List::get_selected_item_text_abi_cxx11_
            ((List *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    ::font = font_ttf;
  }
  else {
    List::get_selected_item_text_abi_cxx11_
              ((List *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      ::font = font_bmp;
    }
    else {
      List::get_selected_item_text_abi_cxx11_
                ((List *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar1) {
        ::font = font_bin;
      }
    }
  }
  List::get_selected_item_text_abi_cxx11_
            ((List *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    local_24 = 4;
  }
  else {
    List::get_selected_item_text_abi_cxx11_
              ((List *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      local_24 = 5;
      local_c = iVar2 / 2 + 10;
    }
    else {
      List::get_selected_item_text_abi_cxx11_
                ((List *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      bVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar1) {
        local_24 = 6;
        local_c = iVar2 + 10;
      }
    }
  }
  fVar5 = (float)(iVar2 + 10);
  uVar6 = 0x421c0000;
  tick = 0;
  uVar7 = al_map_rgb(0xff,0);
  uVar8 = 0x42180000;
  y_00 = 0;
  al_draw_rectangle(0x41200000,0x42180000,fVar5,uVar6,uVar7,in_XMM1_Qa);
  fVar5 = (float)local_c;
  x_00 = 0x42200000;
  max_width = (float)(iVar3 + 0x28);
  uVar7 = al_map_rgb(tick,0xff);
  al_draw_line(fVar5,x_00,fVar5,max_width,uVar7,uVar8,y_00);
  uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
  uVar6 = (undefined4)((ulong)uVar7 >> 0x20);
  uVar8 = 0x3f800000;
  font = ::font;
  uVar7 = al_map_rgb_f(0x3f800000);
  al_draw_multiline_text
            (uVar7,uVar8,(float)local_c,0x42200000,CONCAT44(uVar6,(float)iVar2),
             CONCAT44(uVar9,(float)iVar3),font,local_24,pcVar4);
  uVar8 = 0x3f800000;
  text_00 = ::font;
  uVar7 = al_map_rgb_f(0x3f800000);
  al_draw_text(uVar7,uVar8,(float)(iVar2 + 10),0x41200000,text_00,0,"Custom multiline text:");
  draw_custom_multiline(font,x_00,y_00,(int)max_width,(int)fVar5,tick,(char *)text_00);
  return;
}

Assistant:

void Prog::draw_text()
{
   int x  = 10, y  = 10;
   int sx = 10, sy = 10;
   int w = width_slider.get_cur_value();
   int h = height_slider.get_cur_value();
   int flags = 0;
   const char * text = text_entry.get_text();

   if (text_font.get_selected_item_text() == "Truetype") {
      font = font_ttf;
   } else if (text_font.get_selected_item_text() == "Bitmap") {
      font = font_bmp;
   } else if (text_font.get_selected_item_text() == "Builtin") {
      font = font_bin;
   }
   
   if (text_align.get_selected_item_text() == "Left") {
      flags = ALLEGRO_ALIGN_LEFT | ALLEGRO_ALIGN_INTEGER;
   } else if (text_align.get_selected_item_text() == "Center") {
      flags = ALLEGRO_ALIGN_CENTER | ALLEGRO_ALIGN_INTEGER;
      x = 10 + w / 2;
   } else if (text_align.get_selected_item_text() == "Right") {
      flags = ALLEGRO_ALIGN_RIGHT | ALLEGRO_ALIGN_INTEGER;
      x  = 10 + w;
   }
  

   /* Draw a red rectangle on the top with the requested width,
    * a blue rectangle around the real bounds of the text, 
    * a green line for the X axis location of drawing the text
    * and the line height, and finally the text itself.
    */
    
   al_draw_rectangle(sx, sy-2 + 30, sx + w, sy - 1 + 30, al_map_rgb(255, 0, 0), 0);
   al_draw_line(x, y + 30, x, y + h + 30, al_map_rgb(0, 255, 0), 0);
   al_draw_multiline_text(font, al_map_rgb_f(1, 1, 1), x, y + 30, w, h, flags, text);

   /* also do some custom bultiline drawing */
   al_draw_text(font, al_map_rgb_f(1, 1, 1), w + 10, y, 0, "Custom multiline text:" );
   draw_custom_multiline(font, w + 10 , y + 30, w, h, tick, text);
}